

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O1

void __thiscall
cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
          (cmGeneratorExpressionEvaluationFile *this,string *input,
          auto_ptr<cmCompiledGeneratorExpression> *outputFileExpr,
          auto_ptr<cmCompiledGeneratorExpression> *condition,bool inputIsContent)

{
  pointer pcVar1;
  cmCompiledGeneratorExpression *pcVar2;
  
  (this->Input)._M_dataplus._M_p = (pointer)&(this->Input).field_2;
  pcVar1 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + input->_M_string_length);
  pcVar2 = outputFileExpr->x_;
  outputFileExpr->x_ = (cmCompiledGeneratorExpression *)0x0;
  (this->OutputFileExpr).x_ = pcVar2;
  pcVar2 = condition->x_;
  condition->x_ = (cmCompiledGeneratorExpression *)0x0;
  (this->Condition).x_ = pcVar2;
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->InputIsContent = inputIsContent;
  return;
}

Assistant:

cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile(
        const std::string &input,
        cmsys::auto_ptr<cmCompiledGeneratorExpression> outputFileExpr,
        cmsys::auto_ptr<cmCompiledGeneratorExpression> condition,
        bool inputIsContent)
  : Input(input),
    OutputFileExpr(outputFileExpr),
    Condition(condition),
    InputIsContent(inputIsContent)
{
}